

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bsdiff.c
# Opt level: O0

void split(int64_t *I,int64_t *V,int64_t start,int64_t len,int64_t h)

{
  int64_t iVar1;
  long lVar2;
  long lVar3;
  long local_68;
  int64_t kk;
  int64_t jj;
  int64_t tmp;
  int64_t x;
  int64_t k;
  int64_t j;
  int64_t i;
  int64_t h_local;
  int64_t len_local;
  int64_t start_local;
  int64_t *V_local;
  int64_t *I_local;
  
  x = start;
  if (len < 0x10) {
    for (; x < start + len; x = k + x) {
      k = 1;
      tmp = V[I[x] + h];
      for (j = 1; x + j < start + len; j = j + 1) {
        if (V[I[x + j] + h] < tmp) {
          tmp = V[I[x + j] + h];
          k = 0;
        }
        if (V[I[x + j] + h] == tmp) {
          iVar1 = I[x + k];
          I[x + k] = I[x + j];
          I[x + j] = iVar1;
          k = k + 1;
        }
      }
      for (j = 0; j < k; j = j + 1) {
        V[I[x + j]] = x + k + -1;
      }
      if (k == 1) {
        I[x] = -1;
      }
    }
  }
  else {
    lVar2 = V[I[start + len / 2] + h];
    kk = 0;
    local_68 = 0;
    for (j = start; j < start + len; j = j + 1) {
      if (V[I[j] + h] < lVar2) {
        kk = kk + 1;
      }
      if (V[I[j] + h] == lVar2) {
        local_68 = local_68 + 1;
      }
    }
    lVar3 = start + kk;
    local_68 = lVar3 + local_68;
    k = 0;
    x = 0;
    j = start;
    while (j < lVar3) {
      if (V[I[j] + h] < lVar2) {
        j = j + 1;
      }
      else if (V[I[j] + h] == lVar2) {
        iVar1 = I[j];
        I[j] = I[lVar3 + k];
        I[lVar3 + k] = iVar1;
        k = k + 1;
      }
      else {
        iVar1 = I[j];
        I[j] = I[local_68 + x];
        I[local_68 + x] = iVar1;
        x = x + 1;
      }
    }
    while (lVar3 + k < local_68) {
      if (V[I[lVar3 + k] + h] == lVar2) {
        k = k + 1;
      }
      else {
        iVar1 = I[lVar3 + k];
        I[lVar3 + k] = I[local_68 + x];
        I[local_68 + x] = iVar1;
        x = x + 1;
      }
    }
    if (start < lVar3) {
      split(I,V,start,lVar3 - start,h);
    }
    for (j = 0; j < local_68 - lVar3; j = j + 1) {
      V[I[lVar3 + j]] = local_68 + -1;
    }
    if (lVar3 == local_68 + -1) {
      I[lVar3] = -1;
    }
    if (local_68 < start + len) {
      split(I,V,local_68,(start + len) - local_68,h);
    }
  }
  return;
}

Assistant:

static void split(int64_t *I,int64_t *V,int64_t start,int64_t len,int64_t h)
{
	int64_t i,j,k,x,tmp,jj,kk;

	if(len<16) {
		for(k=start;k<start+len;k+=j) {
			j=1;x=V[I[k]+h];
			for(i=1;k+i<start+len;i++) {
				if(V[I[k+i]+h]<x) {
					x=V[I[k+i]+h];
					j=0;
				};
				if(V[I[k+i]+h]==x) {
					tmp=I[k+j];I[k+j]=I[k+i];I[k+i]=tmp;
					j++;
				};
			};
			for(i=0;i<j;i++) V[I[k+i]]=k+j-1;
			if(j==1) I[k]=-1;
		};
		return;
	};

	x=V[I[start+len/2]+h];
	jj=0;kk=0;
	for(i=start;i<start+len;i++) {
		if(V[I[i]+h]<x) jj++;
		if(V[I[i]+h]==x) kk++;
	};
	jj+=start;kk+=jj;

	i=start;j=0;k=0;
	while(i<jj) {
		if(V[I[i]+h]<x) {
			i++;
		} else if(V[I[i]+h]==x) {
			tmp=I[i];I[i]=I[jj+j];I[jj+j]=tmp;
			j++;
		} else {
			tmp=I[i];I[i]=I[kk+k];I[kk+k]=tmp;
			k++;
		};
	};

	while(jj+j<kk) {
		if(V[I[jj+j]+h]==x) {
			j++;
		} else {
			tmp=I[jj+j];I[jj+j]=I[kk+k];I[kk+k]=tmp;
			k++;
		};
	};

	if(jj>start) split(I,V,start,jj-start,h);

	for(i=0;i<kk-jj;i++) V[I[jj+i]]=kk-1;
	if(jj==kk-1) I[jj]=-1;

	if(start+len>kk) split(I,V,kk,start+len-kk,h);
}